

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O1

void Omega_h::copy_into<int>(Read<signed_char> *a,Write<int> *b)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  long *plVar4;
  Alloc **ppAVar5;
  ulong uVar6;
  ulong uVar7;
  Alloc *pAVar8;
  size_t sVar9;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  string __str;
  ScopedTimer local_a9;
  undefined1 local_a8 [24];
  void *pvStack_90;
  Alloc **local_88;
  long local_80;
  Alloc *local_78 [2];
  Alloc **local_68;
  long local_60;
  Alloc *local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,"");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
  ppAVar5 = (Alloc **)(plVar4 + 2);
  if ((Alloc **)*plVar4 == ppAVar5) {
    local_58 = *ppAVar5;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *ppAVar5;
    local_68 = (Alloc **)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)ppAVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,3,0x152);
  pAVar8 = (Alloc *)0xf;
  if (local_68 != &local_58) {
    pAVar8 = local_58;
  }
  if (pAVar8 < (Alloc *)(local_60 + local_80)) {
    pAVar8 = (Alloc *)0xf;
    if (local_88 != local_78) {
      pAVar8 = local_78[0];
    }
    if ((Alloc *)(local_60 + local_80) <= pAVar8) {
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68)
      ;
      goto LAB_001faf57;
    }
  }
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_001faf57:
  local_a8._0_8_ = local_a8 + 0x10;
  pAVar8 = (Alloc *)(plVar4 + 2);
  if ((Alloc *)*plVar4 == pAVar8) {
    local_a8._16_8_ = pAVar8->size;
    pvStack_90 = (void *)plVar4[3];
  }
  else {
    local_a8._16_8_ = pAVar8->size;
    local_a8._0_8_ = (Alloc *)*plVar4;
  }
  local_a8._8_8_ = plVar4[1];
  *plVar4 = (long)pAVar8;
  plVar4[1] = 0;
  *(undefined1 *)&pAVar8->size = 0;
  begin_code("copy_into",(char *)local_a8._0_8_);
  if ((Alloc *)local_a8._0_8_ != (Alloc *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,(ulong)((long)(size_t *)local_a8._16_8_ + 1));
  }
  if (local_88 != local_78) {
    operator_delete(local_88,(ulong)((long)&local_78[0]->size + 1));
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,(ulong)((long)&local_58->size + 1));
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pAVar8 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar8 & 1) == 0) {
    uVar6 = pAVar8->size;
  }
  else {
    uVar6 = (ulong)pAVar8 >> 3;
  }
  pAVar2 = (b->shared_alloc_).alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar7 = pAVar2->size;
  }
  else {
    uVar7 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar6 >> 2) == (int)(uVar7 >> 2)) {
    local_a8._0_8_ = pAVar2;
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8._0_8_ = (Alloc *)(pAVar2->size * 8 + 1);
      }
      else {
        pAVar2->use_count = pAVar2->use_count + 1;
      }
    }
    local_a8._8_8_ = (b->shared_alloc_).direct_ptr;
    local_a8._16_8_ = pAVar8;
    if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8._16_8_ = (Alloc *)(pAVar8->size * 8 + 1);
      }
      else {
        pAVar8->use_count = pAVar8->use_count + 1;
      }
    }
    pvStack_90 = (a->write_).shared_alloc_.direct_ptr;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar9 = pAVar2->size;
    }
    else {
      sVar9 = (ulong)pAVar2 >> 3;
    }
    parallel_for<Omega_h::copy_into<int>(Omega_h::Read<int>,Omega_h::Write<int>)::_lambda(int)_1_>
              ((LO)(sVar9 >> 2),(type *)local_a8,"copy into kernel");
    uVar3 = local_a8._16_8_;
    if ((local_a8._16_8_ & 7) == 0 && (Alloc *)local_a8._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_a8._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_a8._16_8_);
        operator_delete((void *)uVar3,0x48);
      }
    }
    uVar3 = local_a8._0_8_;
    if ((local_a8._0_8_ & 7) == 0 && (Alloc *)local_a8._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_a8._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_a8._0_8_);
        operator_delete((void *)uVar3,0x48);
      }
    }
    ScopedTimer::~ScopedTimer(&local_a9);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
       ,0x153);
}

Assistant:

void copy_into(Read<T> a, Write<T> b) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(a.size() == b.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = a[i]; };
  parallel_for(b.size(), f, "copy into kernel");
}